

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmudp.c
# Opt level: O1

attr_list libcmudp_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  long lVar1;
  atom_t aVar2;
  uint uVar3;
  int iVar4;
  uint __fd;
  int iVar5;
  attr_list p_Var6;
  char *pcVar7;
  uint *puVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  ssize_t sVar12;
  undefined8 *extraout_RDX;
  sockaddr *__addr;
  void *pvVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  int int_port_num;
  sockaddr_in addr;
  int one;
  uint nl;
  socklen_t sStack_c0;
  sockaddr sStack_bc;
  undefined1 auStack_ac [4];
  CMtrans_services_conflict pCStack_a8;
  attr_list p_Stack_a0;
  transport_entry_conflict p_Stack_98;
  void *pvStack_90;
  CManager p_Stack_88;
  code *pcStack_80;
  uint local_6c;
  sockaddr local_68;
  undefined4 local_4c;
  transport_entry_conflict local_48;
  void *local_40;
  socklen_t local_34;
  
  pvVar13 = trans->trans_data;
  local_6c = 0;
  local_4c = 1;
  pcStack_80 = (code *)0x1034f2;
  uVar3 = get_self_ip_addr(cm,svc);
  if (listen_info != (attr_list)0x0) {
    pcStack_80 = (code *)0x10350e;
    iVar4 = query_attr(listen_info,CM_UDP_PORT,0,&local_6c);
    if (iVar4 == 0) {
      pcStack_80 = (code *)0x103542;
      (*svc->trace_out)(cm,"CMUDP transport found no UDP_PORT attribute");
      local_6c = 0;
      goto LAB_0010354a;
    }
  }
  if (0xffff < local_6c) {
    pcStack_80 = (code *)0x1036f4;
    fprintf(_stderr,"Requested port number %d is invalid\n");
    return (attr_list)0x0;
  }
  pcStack_80 = (code *)0x103531;
  (*svc->trace_out)(cm,"CMUDP transport connect to port %d");
LAB_0010354a:
  uVar14 = 2;
  iVar4 = 2;
  pcStack_80 = (code *)0x10355b;
  __fd = socket(2,2,0);
  if ((int)__fd < 0) {
    pcStack_80 = (code *)0x1036fb;
    libcmudp_LTX_non_blocking_listen_cold_2();
  }
  else {
    listen_info = (attr_list)(ulong)__fd;
    local_68.sa_data[6] = '\0';
    local_68.sa_data[7] = '\0';
    local_68.sa_data[8] = '\0';
    local_68.sa_data[9] = '\0';
    local_68.sa_data[10] = '\0';
    local_68.sa_data[0xb] = '\0';
    local_68.sa_data[0xc] = '\0';
    local_68.sa_data[0xd] = '\0';
    local_68.sa_data._0_2_ = (ushort)local_6c << 8 | (ushort)local_6c >> 8;
    local_68.sa_family = 2;
    local_68.sa_data._2_4_ = 0;
    pcStack_80 = (code *)0x1035a8;
    iVar4 = setsockopt(__fd,1,0xf,&local_4c,4);
    if (iVar4 == -1) {
      pcStack_80 = (code *)0x1036c3;
      perror("setsockopt reuseport");
    }
    __addr = &local_68;
    uVar14 = (ulong)__fd;
    pcStack_80 = (code *)0x1035c3;
    iVar5 = bind(__fd,__addr,0x10);
    iVar4 = (int)__addr;
    if (-1 < iVar5) {
      local_34 = 0x10;
      pcStack_80 = (code *)0x1035ed;
      local_48 = trans;
      local_40 = pvVar13;
      iVar4 = getsockname(__fd,&local_68,&local_34);
      if (iVar4 != 0) {
        pcStack_80 = (code *)0x1036d4;
        perror("getsockname");
      }
      local_68.sa_data._2_4_ =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      pcStack_80 = (code *)0x103602;
      p_Var6 = (attr_list)create_attr_list();
      pcStack_80 = (code *)0x10361b;
      add_attr(p_Var6,CM_UDP_ADDR,1,(long)(int)uVar3);
      pcStack_80 = (code *)0x10363a;
      add_attr(p_Var6,CM_UDP_PORT,1,
               local_68.sa_data._0_2_ << 8 | (ushort)local_68.sa_data._0_2_ >> 8);
      aVar2 = CM_TRANSPORT;
      pcStack_80 = (code *)0x10364d;
      pcVar7 = strdup("udp");
      pcStack_80 = (code *)0x103660;
      add_attr(p_Var6,aVar2,3,pcVar7);
      pcStack_80 = (code *)0x103672;
      (*svc->trace_out)(cm,"CMudp Adding libcmudp_data_available as action on fd %d",(ulong)__fd);
      pcStack_80 = (code *)0x10368a;
      (*svc->fd_add_select)(cm,__fd,libcmudp_data_available,local_48,(void *)(ulong)__fd);
      *(uint *)((long)local_40 + 0x10) = __fd;
      *(uint *)((long)local_40 + 0x14) = uVar3;
      *(uint *)((long)local_40 + 0x18) =
           (uint)(ushort)(local_68.sa_data._0_2_ << 8 | (ushort)local_68.sa_data._0_2_ >> 8);
      return p_Var6;
    }
  }
  pcStack_80 = libcmudp_data_available;
  libcmudp_LTX_non_blocking_listen_cold_1();
  lVar1 = *(long *)(uVar14 + 0x98);
  puVar8 = *(uint **)(lVar1 + 0x28);
  sStack_c0 = 0x10;
  pCStack_a8 = svc;
  p_Stack_a0 = listen_info;
  p_Stack_98 = trans;
  pvStack_90 = pvVar13;
  p_Stack_88 = cm;
  pcStack_80 = (code *)(ulong)uVar3;
  p_Var6 = (attr_list)recvfrom(iVar4,auStack_ac,4,2,&sStack_bc,&sStack_c0);
  if (p_Var6 == (attr_list)0x4) {
    for (; puVar8 != (uint *)0x0; puVar8 = *(uint **)(puVar8 + 0x10)) {
      auVar15[0] = -((char)puVar8[2] == (char)sStack_bc.sa_family);
      auVar15[1] = -(*(char *)((long)puVar8 + 9) == (char)(sStack_bc.sa_family >> 8));
      auVar15[2] = -(*(char *)((long)puVar8 + 10) == sStack_bc.sa_data[0]);
      auVar15[3] = -(*(char *)((long)puVar8 + 0xb) == sStack_bc.sa_data[1]);
      auVar15[4] = -((char)puVar8[3] == sStack_bc.sa_data[2]);
      auVar15[5] = -(*(char *)((long)puVar8 + 0xd) == sStack_bc.sa_data[3]);
      auVar15[6] = -(*(char *)((long)puVar8 + 0xe) == sStack_bc.sa_data[4]);
      auVar15[7] = -(*(char *)((long)puVar8 + 0xf) == sStack_bc.sa_data[5]);
      auVar15[8] = -((char)puVar8[4] == sStack_bc.sa_data[6]);
      auVar15[9] = -(*(char *)((long)puVar8 + 0x11) == sStack_bc.sa_data[7]);
      auVar15[10] = -(*(char *)((long)puVar8 + 0x12) == sStack_bc.sa_data[8]);
      auVar15[0xb] = -(*(char *)((long)puVar8 + 0x13) == sStack_bc.sa_data[9]);
      auVar15[0xc] = -((char)puVar8[5] == sStack_bc.sa_data[10]);
      auVar15[0xd] = -(*(char *)((long)puVar8 + 0x15) == sStack_bc.sa_data[0xb]);
      auVar15[0xe] = -(*(char *)((long)puVar8 + 0x16) == sStack_bc.sa_data[0xc]);
      auVar15[0xf] = -(*(char *)((long)puVar8 + 0x17) == sStack_bc.sa_data[0xd]);
      if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
        pcVar7 = "UDP data available on existing connetion, IP addr %lx\n";
        goto LAB_00103831;
      }
    }
    puVar8 = (uint *)(*(code *)**(undefined8 **)(lVar1 + 8))(0x48);
    puVar8[6] = 0;
    puVar8[7] = 0;
    puVar8[1] = 0xffffffff;
    puVar8[0x10] = 0;
    puVar8[0x11] = 0;
    uVar9 = create_attr_list();
    uVar10 = (**(code **)(*(long *)(lVar1 + 8) + 0x40))(uVar14,puVar8,uVar9);
    *(ulong *)(puVar8 + 2) =
         CONCAT44(sStack_bc.sa_data._2_4_,CONCAT22(sStack_bc.sa_data._0_2_,sStack_bc.sa_family));
    *(undefined8 *)(puVar8 + 4) = sStack_bc.sa_data._6_8_;
    uVar3 = (uint)sStack_bc.sa_data._2_4_ >> 0x18 | (sStack_bc.sa_data._2_4_ & 0xff0000) >> 8 |
            (sStack_bc.sa_data._2_4_ & 0xff00) << 8 | sStack_bc.sa_data._2_4_ << 0x18;
    *puVar8 = uVar3;
    puVar8[1] = (uint)(ushort)(sStack_bc.sa_data._0_2_ << 8 | (ushort)sStack_bc.sa_data._0_2_ >> 8);
    *(long *)(puVar8 + 10) = lVar1;
    *(undefined8 *)(puVar8 + 0xc) = uVar10;
    *(undefined8 *)(puVar8 + 0xe) = uVar9;
    puVar8[0x10] = 0;
    puVar8[0x11] = 0;
    uVar10 = *(undefined8 *)(lVar1 + 0x28);
    *(uint **)(lVar1 + 0x28) = puVar8;
    *(undefined8 *)(puVar8 + 0x10) = uVar10;
    add_attr(uVar9,CM_UDP_ADDR,1,(long)(int)uVar3);
    add_attr(uVar9,CM_UDP_PORT,1,(long)(int)puVar8[1]);
    pcVar7 = "UDP data available on new connetion, IP addr %lx\n";
LAB_00103831:
    (**(code **)(*(long *)(lVar1 + 8) + 0x30))(*(undefined8 *)(uVar14 + 8),pcVar7,*puVar8);
    puVar11 = (undefined8 *)
              (**(code **)(*(long *)(lVar1 + 8) + 0x68))(*(undefined8 *)(uVar14 + 8),0x6404);
    *(undefined8 **)(puVar8 + 6) = puVar11;
    pvVar13 = (void *)*puVar11;
    puVar11 = (undefined8 *)0x0;
    sVar12 = recvfrom(iVar4,pvVar13,0x6400,0,&sStack_bc,&sStack_c0);
    if (sVar12 < 0) {
      libcmudp_data_available_cold_1();
      *extraout_RDX = *(undefined8 *)((long)pvVar13 + 0x20);
      *puVar11 = 0;
      *(undefined8 *)((long)pvVar13 + 0x20) = 0;
      return *(attr_list *)((long)pvVar13 + 0x18);
    }
    *(ssize_t *)(puVar8 + 8) = sVar12;
    (**(code **)(uVar14 + 0x18))(uVar14,*(undefined8 *)(puVar8 + 0xc));
    p_Var6 = (attr_list)
             (**(code **)(*(long *)(lVar1 + 8) + 0x70))
                       (*(undefined8 *)(uVar14 + 8),*(undefined8 *)(puVar8 + 6));
  }
  return p_Var6;
}

Assistant:

extern attr_list
libcmudp_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    udp_transport_data_ptr utd = trans->trans_data;
    int int_port_num = 0;
    u_short port_num;
    attr_list listen_list;
    unsigned int nl;
    int one = 1;
    SOCKET socket_fd;
    struct sockaddr_in addr;
    int IP = get_self_ip_addr(cm, svc);

    if (listen_info != NULL &&
	(!query_attr(listen_info, CM_UDP_PORT, /* type pointer */ NULL,
		     (attr_value *) (intptr_t) &int_port_num))) {
	svc->trace_out(cm, "CMUDP transport found no UDP_PORT attribute");
	int_port_num = 0;
    } else {
	if (int_port_num > USHRT_MAX || int_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", int_port_num);
	    return NULL;
	}
	svc->trace_out(cm, "CMUDP transport connect to port %d", int_port_num);
    }
    if ((socket_fd = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
	perror("socket");
	exit(1);
    }
    port_num = int_port_num;

    memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = htonl(INADDR_ANY);	/* N.B.: differs from *
						 * sender */
    addr.sin_port = htons(port_num);
#ifdef SO_REUSEPORT
    if (setsockopt(socket_fd, SOL_SOCKET, SO_REUSEPORT, (char *) &one, sizeof(one)) == -1) {
	perror("setsockopt reuseport");
    }
#else
    if (setsockopt(socket_fd, SOL_SOCKET, SO_REUSEADDR, (char *) &one, sizeof(one)) == -1) {
	perror("setsockopt reuseport");
    }
#endif
    /* bind to receive address */
    if (bind(socket_fd, (struct sockaddr *) &addr, sizeof(addr)) < 0) {
	perror("bind");
	exit(1);
    }
    nl = sizeof(struct sockaddr_in);
    if (getsockname(socket_fd, (struct sockaddr *) &addr, &nl) != 0)
	perror("getsockname");
    

    addr.sin_addr.s_addr = htonl(IP);
    listen_list = create_attr_list();
    add_attr(listen_list, CM_UDP_ADDR, Attr_Int4,
	     (attr_value) (long)IP);
    add_attr(listen_list, CM_UDP_PORT, Attr_Int4,
	     (attr_value) (long) ntohs(addr.sin_port));
    add_attr(listen_list, CM_TRANSPORT, Attr_String,
	     (attr_value) strdup("udp"));
    svc->trace_out(cm, "CMudp Adding libcmudp_data_available as action on fd %d", socket_fd);
    svc->fd_add_select(cm, socket_fd, libcmudp_data_available,
		       (void *) trans, (void *) (intptr_t)socket_fd);
    utd->socket_fd = socket_fd;
    utd->self_ip = IP;
    utd->self_port = ntohs(addr.sin_port);
    return listen_list;
}